

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
* __thiscall
data_structures::
LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
::clear(LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *this)

{
  bool bVar1;
  LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *this_local;
  
  while( true ) {
    bVar1 = isEmpty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    deleteFromHeader(this);
  }
  this->_tail = this->_header;
  this->_size = 0;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::clear(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        _tail = _header;
        _size = 0;
        return this;
    }